

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshParameters::Read(ON_MeshParameters *this,ON_BinaryArchive *file)

{
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ON_MeshParameters *this_00;
  long lVar7;
  uchar mesher;
  int i;
  int minor_version;
  uint local_598;
  uint texture_range;
  int major_version;
  int obsolete_m_bWeld;
  double obsolete_m_combine_angle;
  ON_SHA1_Hash archive_mp_hash;
  ON_SHA1_Hash local_56c;
  ON_SubDDisplayParameters subdp;
  ON_SubDDisplayParameters mp_subdp;
  ON_SubDDisplayParameters archive_subdp;
  ON_MeshParameters mp [5];
  
  memcpy(this,&DefaultMesh,0xe0);
  uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_geometry_settings_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_
  ;
  *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  major_version = 0;
  minor_version = 0;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if (!bVar2) {
    return bVar2;
  }
  if (major_version != 1) {
    return bVar2;
  }
  i = (int)this->m_bComputeCurvature;
  bVar2 = ON_BinaryArchive::ReadInt(file,&i);
  this->m_bComputeCurvature = i != 0;
  i = (int)this->m_bSimplePlanes;
  if (bVar2) {
    i = (uint)this->m_bSimplePlanes;
    bVar2 = ON_BinaryArchive::ReadInt(file,&i);
  }
  else {
    bVar2 = false;
  }
  this->m_bSimplePlanes = i != 0;
  i = (int)this->m_bRefine;
  if (bVar2 == false) {
    bVar2 = false;
  }
  else {
    i = (uint)this->m_bRefine;
    bVar2 = ON_BinaryArchive::ReadInt(file,&i);
  }
  this->m_bRefine = i != 0;
  i = (int)this->m_bJaggedSeams;
  if (bVar2 == false) {
    this->m_bJaggedSeams = this->m_bJaggedSeams;
  }
  else {
    bVar2 = ON_BinaryArchive::ReadInt(file,&i);
    this->m_bJaggedSeams = i != 0;
    if (((((((bVar2) && (bVar2 = ON_BinaryArchive::ReadInt(file,&obsolete_m_bWeld), bVar2)) &&
           (bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance), bVar2)) &&
          ((bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_min_edge_length), bVar2 &&
           (bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_max_edge_length), bVar2)))) &&
         ((bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_aspect_ratio), bVar2 &&
          ((bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_grid_min_count), bVar2 &&
           (bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_grid_max_count), bVar2)))))) &&
        (bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_angle_radians), bVar2)) &&
       ((bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_amplification), bVar2 &&
        (bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_refine_angle_radians), bVar2)))) {
      bVar2 = ON_BinaryArchive::ReadDouble(file,&obsolete_m_combine_angle);
      local_598 = (uint)this->m_face_type;
      if ((bVar2) && (bVar2 = ON_BinaryArchive::ReadInt(file,&local_598), bVar2)) {
        SetFaceType(this,local_598);
        if (minor_version < 1) {
          return true;
        }
        texture_range = (uint)this->m_texture_range;
        bVar2 = ON_BinaryArchive::ReadInt(file,&texture_range);
        if (bVar2) {
          SetTextureRange(this,texture_range);
          if (minor_version < 2) {
            return true;
          }
          bVar2 = ON_BinaryArchive::ReadBool(file,&this->m_bCustomSettings);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_relative_tolerance);
            if (!bVar2) {
              return bVar2;
            }
            if (minor_version < 3) {
              return bVar2;
            }
            mesher = this->m_mesher;
            bVar2 = ON_BinaryArchive::ReadChar(file,&mesher);
            if (bVar2) {
              SetMesher(this,(uint)mesher);
              if (minor_version < 4) {
                return true;
              }
              bVar2 = ON_BinaryArchive::ReadBool(file,&this->m_bCustomSettingsEnabled);
              if (!bVar2) {
                return bVar2;
              }
              if (minor_version < 5) {
                return bVar2;
              }
              subdp.m_progress_reporter_interval.m_t[0] =
                   ON_SubDDisplayParameters::Default.m_progress_reporter_interval.m_t[0];
              subdp.m_progress_reporter_interval.m_t[1] =
                   ON_SubDDisplayParameters::Default.m_progress_reporter_interval.m_t[1];
              subdp.m_terminator = ON_SubDDisplayParameters::Default.m_terminator;
              subdp.m_progress_reporter = ON_SubDDisplayParameters::Default.m_progress_reporter;
              subdp.m_reserved6 = ON_SubDDisplayParameters::Default.m_reserved6;
              subdp.m_reserved7 = ON_SubDDisplayParameters::Default.m_reserved7;
              subdp.m_bDisplayDensityIsAbsolute =
                   ON_SubDDisplayParameters::Default.m_bDisplayDensityIsAbsolute;
              subdp.m_display_density = ON_SubDDisplayParameters::Default.m_display_density;
              subdp.m_reserved = ON_SubDDisplayParameters::Default.m_reserved;
              subdp.m_bControlNetMesh = ON_SubDDisplayParameters::Default.m_bControlNetMesh;
              subdp.m_context = ON_SubDDisplayParameters::Default.m_context;
              subdp.m_bComputeCurvature = ON_SubDDisplayParameters::Default.m_bComputeCurvature;
              subdp.m_reserved3 = ON_SubDDisplayParameters::Default.m_reserved3;
              subdp.m_reserved4 = ON_SubDDisplayParameters::Default.m_reserved4;
              subdp.m_reserved5 = ON_SubDDisplayParameters::Default.m_reserved5;
              bVar2 = ON_SubDDisplayParameters::Read(&subdp,file);
              if (!bVar2) {
                return bVar2;
              }
              SetSubDDisplayParameters(this,&subdp);
              uVar5 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
              TVar3 = GeometrySettingsType(this);
              if (TVar3 != Custom) {
                return bVar2;
              }
              uVar6 = ON_VersionNumberConstruct(7,1,0x7e4,0xc,1,0);
              if (uVar6 <= uVar5) {
                return bVar2;
              }
              GeometrySettingsHash(&archive_mp_hash,this);
              SubDDisplayParameters(&archive_subdp,this);
              memcpy(mp,&DefaultMesh,0xe0);
              memcpy(mp + 1,&FastRenderMesh,0xe0);
              memcpy(mp + 2,&QualityRenderMesh,0xe0);
              memcpy(mp + 3,&DefaultAnalysisMesh,0xe0);
              CreateFromMeshDensity(mp + 4,this->m_relative_tolerance);
              lVar7 = 0;
              while( true ) {
                if (lVar7 == 0x460) {
                  return bVar2;
                }
                this_00 = (ON_MeshParameters *)(mp[0].m_mesher_id.Data4 + lVar7 + -0x10);
                SubDDisplayParameters(&mp_subdp,this_00);
                SetSubDDisplayParameters(this_00,&archive_subdp);
                GeometrySettingsHash(&local_56c,this_00);
                bVar4 = ::operator==(&archive_mp_hash,&local_56c);
                if (bVar4) break;
                lVar7 = lVar7 + 0xe0;
              }
              SetSubDDisplayParameters(this,&mp_subdp);
              return bVar2;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_MeshParameters::Read( ON_BinaryArchive& file )
{
  *this = ON_MeshParameters::DefaultMesh;
  m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    int i;

    i = m_bComputeCurvature;
    if (rc) rc = file.ReadInt(&i);
    m_bComputeCurvature = i?true:false;

    i = m_bSimplePlanes;
    if (rc) rc = file.ReadInt(&i);
    m_bSimplePlanes = i?true:false;

    i = m_bRefine;
    if (rc) rc = file.ReadInt(&i);
    m_bRefine = i?true:false;

    i = m_bJaggedSeams;
    if (rc) rc = file.ReadInt(&i);
    m_bJaggedSeams = i?true:false;

    int obsolete_m_bWeld;
    if (rc) rc = file.ReadInt(&obsolete_m_bWeld);

    if (rc) rc = file.ReadDouble(&m_tolerance);
    if (rc) rc = file.ReadDouble(&m_min_edge_length);
    if (rc) rc = file.ReadDouble(&m_max_edge_length);
    if (rc) rc = file.ReadDouble(&m_grid_aspect_ratio);
    if (rc) rc = file.ReadInt(&m_grid_min_count);
    if (rc) rc = file.ReadInt(&m_grid_max_count);
    if (rc) rc = file.ReadDouble(&m_grid_angle_radians);
    if (rc) rc = file.ReadDouble(&m_grid_amplification);
    if (rc) rc = file.ReadDouble(&m_refine_angle_radians);
    double obsolete_m_combine_angle;
    if (rc) rc = file.ReadDouble(&obsolete_m_combine_angle);
    unsigned int face_type = FaceType();
    if (rc) rc = file.ReadInt(&face_type);
    if (rc) 
      SetFaceType(face_type);

    if ( rc && minor_version >= 1 ) 
    {
      unsigned int texture_range = TextureRange();
      rc = file.ReadInt( &texture_range );
      if (rc)
        SetTextureRange(texture_range);
      if ( rc && minor_version >= 2 )
      {
        rc = file.ReadBool(&m_bCustomSettings);
        if (rc) rc = file.ReadDouble(&m_relative_tolerance);
        if ( rc && minor_version >= 3 )
        {
          unsigned char mesher = (unsigned char)Mesher();
          rc = file.ReadChar(&mesher);
          if (rc)
            SetMesher(mesher);
          if ( rc && minor_version >= 4 )
          {
            rc = file.ReadBool(&m_bCustomSettingsEnabled);
            if (rc && minor_version >= 5)
            {
              ON_SubDDisplayParameters subdp = ON_SubDDisplayParameters::Default;
              rc = subdp.Read(file);
              if (rc)
              {
                this->SetSubDDisplayParameters(subdp);
                Internal_MeshParametersRead_UpdateSubDParameters(file.ArchiveOpenNURBSVersion(), *this);
              }
            }
          }
        }
      }
    }
  }

  return rc;
}